

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devices.c
# Opt level: O0

void process_firmware_event(uevent *uevent)

{
  int iVar1;
  int __fd;
  int __fd_00;
  int iVar2;
  long in_RDI;
  int fw_fd;
  int data_fd;
  int loading_fd;
  int l;
  char *file;
  char *data;
  char *loading;
  char *root;
  int in_stack_00001078;
  int in_stack_0000107c;
  int in_stack_00001080;
  char *local_28;
  char *local_20;
  char *local_18;
  char *local_10;
  long local_8;
  
  local_8 = in_RDI;
  log_write(6,"<6>init: firmware event { \'%s\', \'%s\' }\n",*(undefined8 *)(in_RDI + 8),
            *(undefined8 *)(in_RDI + 0x18));
  iVar1 = asprintf(&local_10,"/sys%s/",*(undefined8 *)(local_8 + 8));
  if (iVar1 != -1) {
    iVar1 = asprintf(&local_18,"%sloading",local_10);
    if (iVar1 != -1) {
      iVar1 = asprintf(&local_20,"%sdata",local_10);
      if (iVar1 != -1) {
        iVar1 = asprintf(&local_28,"/etc/firmware/%s",*(undefined8 *)(local_8 + 0x18));
        if (iVar1 != -1) {
          iVar1 = open(local_18,1);
          if (-1 < iVar1) {
            __fd = open(local_20,1);
            if (-1 < __fd) {
              __fd_00 = open(local_28,0);
              if (-1 < __fd_00) {
                iVar2 = load_firmware(in_stack_00001080,in_stack_0000107c,in_stack_00001078);
                if (iVar2 == 0) {
                  log_write(6,"<6>init: firmware copy success { \'%s\', \'%s\' }\n",local_10,
                            local_28);
                }
                else {
                  log_write(6,"<6>init: firmware copy failure { \'%s\', \'%s\' }\n",local_10,
                            local_28);
                }
                close(__fd_00);
              }
              close(__fd);
            }
            close(iVar1);
          }
          free(local_28);
        }
        free(local_20);
      }
      free(local_18);
    }
    free(local_10);
  }
  return;
}

Assistant:

static void process_firmware_event(struct uevent *uevent)
{
    char *root, *loading, *data, *file;
    int l, loading_fd, data_fd, fw_fd;

    log_event_print("firmware event { '%s', '%s' }\n",
                    uevent->path, uevent->firmware);

    l = asprintf(&root, SYSFS_PREFIX"%s/", uevent->path);
    if (l == -1)
        return;

    l = asprintf(&loading, "%sloading", root);
    if (l == -1)
        goto root_free_out;

    l = asprintf(&data, "%sdata", root);
    if (l == -1)
        goto loading_free_out;

    l = asprintf(&file, FIRMWARE_DIR"/%s", uevent->firmware);
    if (l == -1)
        goto data_free_out;

    loading_fd = open(loading, O_WRONLY);
    if(loading_fd < 0)
        goto file_free_out;

    data_fd = open(data, O_WRONLY);
    if(data_fd < 0)
        goto loading_close_out;

    fw_fd = open(file, O_RDONLY);
    if(fw_fd < 0)
        goto data_close_out;

    if(!load_firmware(fw_fd, loading_fd, data_fd))
        log_event_print("firmware copy success { '%s', '%s' }\n", root, file);
    else
        log_event_print("firmware copy failure { '%s', '%s' }\n", root, file);

    close(fw_fd);
data_close_out:
    close(data_fd);
loading_close_out:
    close(loading_fd);
file_free_out:
    free(file);
data_free_out:
    free(data);
loading_free_out:
    free(loading);
root_free_out:
    free(root);
}